

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O0

void Mvc_CoverDivideByLiteral
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  int iVar1;
  Mvc_Cover_t *pMVar2;
  Mvc_Cover_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  int iVar5;
  Mvc_List_t *pList_1;
  Mvc_List_t *pList;
  int iLit;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCubeC;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t **ppRem_local;
  Mvc_Cover_t **ppQuo_local;
  Mvc_Cover_t *pDiv_local;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = Mvc_CoverReadCubeNum(pDiv);
  if (iVar1 == 1) {
    pMVar2 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
    pMVar3 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
    iVar1 = Mvc_CoverFirstCubeFirstLit(pDiv);
    for (pCubeCopy = (pCover->lCubes).pHead; pCubeCopy != (Mvc_Cube_t *)0x0;
        pCubeCopy = pCubeCopy->pNext) {
      pMVar4 = Mvc_CubeDup(pCover,pCubeCopy);
      iVar5 = iVar1 >> 5;
      if ((pMVar4->pData[iVar5] & 1 << ((byte)iVar1 & 0x1f)) == 0) {
        if ((pMVar3->lCubes).pHead == (Mvc_Cube_t *)0x0) {
          (pMVar3->lCubes).pHead = pMVar4;
        }
        else {
          ((pMVar3->lCubes).pTail)->pNext = pMVar4;
        }
        (pMVar3->lCubes).pTail = pMVar4;
        pMVar4->pNext = (Mvc_Cube_t *)0x0;
        (pMVar3->lCubes).nItems = (pMVar3->lCubes).nItems + 1;
      }
      else {
        pMVar4->pData[iVar5] = (1 << ((byte)iVar1 & 0x1f) ^ 0xffffffffU) & pMVar4->pData[iVar5];
        if ((pMVar2->lCubes).pHead == (Mvc_Cube_t *)0x0) {
          (pMVar2->lCubes).pHead = pMVar4;
        }
        else {
          ((pMVar2->lCubes).pTail)->pNext = pMVar4;
        }
        (pMVar2->lCubes).pTail = pMVar4;
        pMVar4->pNext = (Mvc_Cube_t *)0x0;
        (pMVar2->lCubes).nItems = (pMVar2->lCubes).nItems + 1;
      }
    }
    *ppRem = pMVar3;
    *ppQuo = pMVar2;
    return;
  }
  __assert_fail("Mvc_CoverReadCubeNum(pDiv) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                ,0x14a,
                "void Mvc_CoverDivideByLiteral(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
               );
}

Assistant:

void Mvc_CoverDivideByLiteral( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeCopy;
    int iLit;

    // get the only cube of D
    assert( Mvc_CoverReadCubeNum(pDiv) == 1 );

    // start the quotient and the remainder
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the first and only literal in the divisor cube
    iLit = Mvc_CoverFirstCubeFirstLit( pDiv );

    // iterate through the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCubeC )
    {
        // copy the cube
        pCubeCopy = Mvc_CubeDup( pCover, pCubeC );
        // add the cube to the quotient or to the remainder depending on the literal
        if ( Mvc_CubeBitValue( pCubeCopy, iLit ) )
        {   // remove the literal
            Mvc_CubeBitRemove( pCubeCopy, iLit );
            // add the cube ot the quotient
            Mvc_CoverAddCubeTail( pQuo, pCubeCopy );
        }
        else
        {   // add the cube ot the remainder
            Mvc_CoverAddCubeTail( pRem, pCubeCopy );
        }
    }
    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
}